

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination>::reallocateAndGrow
          (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *old)

{
  CloneDestination *pCVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  bool bVar4;
  undefined7 uVar5;
  long lVar6;
  CloneDestination *pCVar7;
  CloneDestination *pCVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *)0x0 &&
         where == GrowsAtEnd) && (pQVar2 = &this->d->super_QArrayData, pQVar2 != (QArrayData *)0x0))
      && (0 < n)) && ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar9 = QArrayData::reallocateUnaligned
                       (pQVar2,this->ptr,0x10,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4),
                        Grow);
    this->d = (Data *)auVar9._0_8_;
    this->ptr = (CloneDestination *)auVar9._8_8_;
  }
  else {
    local_38.size = -0x5555555555555556;
    local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.ptr = (CloneDestination *)0xaaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) ||
          (old != (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pCVar7 = this->ptr;
        pCVar8 = pCVar7 + lVar6;
        if ((lVar6 != 0) && (0 < lVar6)) {
          do {
            bVar4 = pCVar7->cloneFlipPending;
            uVar5 = *(undefined7 *)&pCVar7->field_0x9;
            pCVar1 = local_38.ptr + local_38.size;
            pCVar1->screen = pCVar7->screen;
            pCVar1->cloneFlipPending = bVar4;
            *(undefined7 *)&pCVar1->field_0x9 = uVar5;
            pCVar7 = pCVar7 + 1;
            local_38.size = local_38.size + 1;
          } while (pCVar7 < pCVar8);
        }
      }
      else {
        pCVar7 = this->ptr;
        pCVar8 = pCVar7 + lVar6;
        if ((lVar6 != 0) && (0 < lVar6)) {
          do {
            bVar4 = pCVar7->cloneFlipPending;
            uVar5 = *(undefined7 *)&pCVar7->field_0x9;
            pCVar1 = local_38.ptr + local_38.size;
            pCVar1->screen = pCVar7->screen;
            pCVar1->cloneFlipPending = bVar4;
            *(undefined7 *)&pCVar1->field_0x9 = uVar5;
            pCVar7 = pCVar7 + 1;
            local_38.size = local_38.size + 1;
          } while (pCVar7 < pCVar8);
        }
      }
    }
    pQVar2 = &this->d->super_QArrayData;
    pCVar7 = this->ptr;
    *(undefined4 *)&this->d = local_38.d._0_4_;
    *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
    *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
    *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
    qVar3 = this->size;
    this->size = local_38.size;
    local_38.d = (Data *)pQVar2;
    local_38.ptr = pCVar7;
    local_38.size = qVar3;
    if (old != (QArrayDataPointer<QEglFSKmsGbmScreen::CloneDestination> *)0x0) {
      local_38.d = old->d;
      old->d = (Data *)pQVar2;
      local_38.ptr = old->ptr;
      old->ptr = pCVar7;
      local_38.size = old->size;
      old->size = qVar3;
    }
    if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }